

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.h
# Opt level: O3

void __thiscall spv::Builder::setDebugSourceLocation(Builder *this,int line,char *filename)

{
  Id IVar1;
  size_t sVar2;
  string local_40;
  
  if (((this->trackDebugInfo == true) && (this->dirtyLineTracker = true, line != 0)) &&
     (this->currentLine = line, filename != (char *)0x0)) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    sVar2 = strlen(filename);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,filename,filename + sVar2);
    IVar1 = getStringId(this,&local_40);
    this->currentFileId = IVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void setDebugSourceLocation(int line, const char* filename)
    {
        if (trackDebugInfo) {
            dirtyLineTracker = true;
            if (line != 0) {
                // TODO: This is special handling of some AST nodes having (untracked) line 0. 
                //       But they should have a valid line number.
                currentLine = line;
                if (filename) {
                    currentFileId = getStringId(filename);
                }
            }
        }
    }